

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<float,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,float>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined1 *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  FloatFormat *fmt_00;
  TestLog *this_01;
  MessageBuilder *pMVar5;
  reference ppFVar6;
  TestLog *this_02;
  ostream *poVar7;
  char *pcVar8;
  RenderContext *pRVar9;
  ulong uVar10;
  Variable<float> *pVVar11;
  reference pvVar12;
  ShaderExecutor *pSVar13;
  undefined8 extraout_RAX;
  TestError *this_03;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *pVVar14;
  const_reference pvVar15;
  IVal *pIVar16;
  const_reference pvVar17;
  reference pvVar18;
  TestLog *this_04;
  TestLog *this_05;
  TestLog *this_06;
  TestLog *this_07;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  double dVar19;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  char (*local_14d0) [7];
  pointer local_1388;
  MessageBuilder local_1378;
  MessageBuilder local_11f8;
  int local_1074;
  MessageBuilder local_1070;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  undefined1 local_d30 [8];
  MessageBuilder builder;
  string local_ba8;
  Interval local_b88;
  allocator<char> local_b69;
  string local_b68;
  Interval local_b48;
  undefined1 local_b30 [8];
  EvalContext ctx;
  IVal local_ae8;
  IVal local_ad0;
  IVal local_ab8;
  IVal local_aa0;
  undefined1 auStack_a88 [8];
  IVal reference1_1;
  undefined1 auStack_a68 [8];
  IVal reference0_1;
  pointer pfStack_a48;
  bool result;
  size_t valueNdx;
  IVal reference1;
  IVal reference0;
  undefined1 local_a08 [6];
  IVal in3;
  IVal in2;
  IVal in1;
  IVal in0;
  void *outputArr [2];
  void *inputArr [4];
  DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor> local_999;
  undefined1 local_998 [8];
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  executor;
  Symbol local_968;
  Symbol local_930;
  Symbol local_8f8;
  Symbol local_8c0;
  Symbol local_888;
  Symbol local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  ApiType local_7d4;
  string local_7d0 [32];
  undefined1 local_7b0 [8];
  ostringstream os;
  MessageBuilder local_618;
  _Self local_498;
  _Self local_490;
  const_iterator it;
  FuncSet funcs;
  ostringstream oss;
  undefined1 local_160 [8];
  Environment env;
  int numErrors;
  int maxMsgs;
  FloatFormat highpFmt;
  undefined1 local_e8 [8];
  ShaderSpec spec;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> outputs;
  size_t numValues;
  int outCount;
  int inCount;
  FloatFormat *fmt;
  Statement *stmt_local;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *inputs_local;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>
  *variables_local;
  PrecisionCase *this_local;
  
  fmt_00 = getFormat(this);
  iVar2 = numInputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,float,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                    ();
  iVar3 = numOutputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,float>>();
  if (iVar2 < 1) {
    local_1388 = (pointer)&DAT_00000001;
  }
  else {
    local_1388 = (pointer)std::vector<float,_std::allocator<float>_>::size(&inputs->in0);
  }
  outputs.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_1388;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>::Outputs
            ((Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> *)
             ((long)&spec.source.field_2 + 8),(size_t)local_1388);
  ShaderExecUtil::ShaderSpec::ShaderSpec((ShaderSpec *)local_e8);
  highpFmt._24_8_ = (this->m_ctx).highpFormat.m_maxValue;
  numErrors = (this->m_ctx).highpFormat.m_minExp;
  unique0x1000145f = (this->m_ctx).highpFormat.m_maxExp;
  highpFmt.m_minExp = (this->m_ctx).highpFormat.m_fractionBits;
  highpFmt.m_maxExp = (this->m_ctx).highpFormat.m_hasSubnormal;
  highpFmt.m_fractionBits = (this->m_ctx).highpFormat.m_hasInf;
  highpFmt.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasNaN;
  highpFmt._16_8_ = *(undefined8 *)&(this->m_ctx).highpFormat.m_exactPrecision;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  Environment::Environment((Environment *)local_160);
  switch(iVar2) {
  case 4:
  case 3:
  case 2:
  case 1:
  default:
    log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    tcu::TestLog::operator<<
              ((MessageBuilder *)&oss.field_0x170,this_01,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&oss.field_0x170,(char (*) [12])"Statement: ");
    pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,stmt);
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&oss.field_0x170);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
    ::set((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
           *)&it);
    Statement::getUsedFuncs
              (stmt,(set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                     *)&it);
    local_490._M_node =
         (_Base_ptr)
         std::
         set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
         ::begin((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                  *)&it);
    while( true ) {
      local_498._M_node =
           (_Base_ptr)
           std::
           set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
           ::end((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                  *)&it);
      bVar1 = std::operator!=(&local_490,&local_498);
      if (!bVar1) break;
      ppFVar6 = std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>::
                operator*(&local_490);
      FuncBase::printDefinition
                (*ppFVar6,(ostream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>::operator++
                (&local_490);
    }
    bVar1 = std::
            set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
            ::empty((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                     *)&it);
    if (!bVar1) {
      log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      tcu::TestLog::operator<<(&local_618,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_618,(char (*) [24])"Reference definitions:\n")
      ;
      std::__cxx11::ostringstream::str();
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&os.field_0x170);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&os.field_0x170);
      tcu::MessageBuilder::~MessageBuilder(&local_618);
    }
    std::
    set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
    ::~set((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
            *)&it);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7b0);
    poVar7 = std::operator<<((ostream *)local_7b0,"precision ");
    pcVar8 = glu::getPrecisionName((this->m_ctx).precision);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::operator<<(poVar7," float;\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)
               &spec.outputs.
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_7d0);
    std::__cxx11::string::~string(local_7d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7b0);
    pRVar9 = getRenderContext(this);
    local_7d4.m_bits = (*pRVar9->_vptr_RenderContext[2])();
    local_e8._0_4_ = glu::getContextTypeGLSLVersion((ContextType)local_7d4.m_bits);
    uVar10 = std::__cxx11::string::empty();
    if ((uVar10 & 1) == 0) {
      std::operator+(&local_818,"#extension ",&this->m_extension);
      std::operator+(&local_7f8,&local_818," : require\n");
      std::__cxx11::string::operator=
                ((string *)
                 &spec.outputs.
                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)&spec,(long)iVar2);
  switch(iVar2) {
  case 4:
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in3).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_850,this,pVVar14);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,3);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_850);
    ShaderExecUtil::Symbol::~Symbol(&local_850);
  case 3:
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_888,this,pVVar14);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,2);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_888);
    ShaderExecUtil::Symbol::~Symbol(&local_888);
  case 2:
    pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                        (&(variables->in1).
                          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>)
    ;
    makeSymbol<float>(&local_8c0,this,pVVar11);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,1);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_8c0);
    ShaderExecUtil::Symbol::~Symbol(&local_8c0);
  case 1:
    pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                        ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> *)
                         variables);
    makeSymbol<float>(&local_8f8,this,pVVar11);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,0);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_8f8);
    ShaderExecUtil::Symbol::~Symbol(&local_8f8);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)&spec.inputs.
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar3);
  if (iVar3 != 1) {
    if (iVar3 != 2) goto LAB_02491340;
    pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                        (&(variables->out1).
                          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>)
    ;
    makeSymbol<float>(&local_930,this,pVVar11);
    pvVar12 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec.inputs.
                               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    ShaderExecUtil::Symbol::operator=(pvVar12,&local_930);
    ShaderExecUtil::Symbol::~Symbol(&local_930);
  }
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                      (&(variables->out0).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  makeSymbol<float>(&local_968,this,pVVar11);
  pvVar12 = std::
            vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                          *)&spec.inputs.
                             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  ShaderExecUtil::Symbol::operator=(pvVar12,&local_968);
  ShaderExecUtil::Symbol::~Symbol(&local_968);
LAB_02491340:
  de::toString<deqp::gls::BuiltinPrecisionTests::Statement>
            ((string *)
             &executor.
              super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              .m_data.field_0x8,stmt);
  this_00 = &executor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.field_0x8;
  std::__cxx11::string::operator=
            ((string *)(spec.globalDeclarations.field_2._M_local_buf + 8),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  pRVar9 = getRenderContext(this);
  pSVar13 = ShaderExecUtil::createExecutor(pRVar9,(this->m_ctx).shaderType,(ShaderSpec *)local_e8);
  de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>::DefaultDeleter(&local_999);
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               *)local_998,pSVar13);
  outputArr[1] = std::vector<float,_std::allocator<float>_>::front(&inputs->in0);
  std::vector<float,_std::allocator<float>_>::front(&inputs->in1);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in2);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in3);
  in0.m_hi = (double)std::vector<float,_std::allocator<float>_>::front
                               ((vector<float,_std::allocator<float>_> *)
                                ((long)&spec.source.field_2 + 8));
  outputArr[0] = std::vector<float,_std::allocator<float>_>::front
                           ((vector<float,_std::allocator<float>_> *)
                            &outputs.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
  pSVar13 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  dVar19 = log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  (*pSVar13->_vptr_ShaderExecutor[3])(SUB84(dVar19,0),pSVar13,extraout_RAX);
  pSVar13 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  uVar4 = (*pSVar13->_vptr_ShaderExecutor[2])();
  if ((uVar4 & 1) == 0) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pSVar13 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  (*pSVar13->_vptr_ShaderExecutor[5])();
  pSVar13 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  (*pSVar13->_vptr_ShaderExecutor[6])
            (pSVar13,(ulong)outputs.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage & 0xffffffff,outputArr + 1,
             &in0.m_hi);
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::~UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                *)local_998);
  tcu::Interval::Interval((Interval *)&in1.m_hi);
  tcu::Interval::Interval((Interval *)local_a08);
  Void::Void((Void *)((long)&reference0.m_hi + 7));
  Void::Void((Void *)((long)&reference0.m_hi + 6));
  tcu::Interval::Interval((Interval *)&reference1.m_hi);
  tcu::Interval::Interval((Interval *)&valueNdx);
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                      ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> *)
                       variables);
  Environment::bind<float>((Environment *)local_160,pVVar11,(IVal *)&in1.m_hi);
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                      (&(variables->in1).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  Environment::bind<float>((Environment *)local_160,pVVar11,(IVal *)local_a08);
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in2).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar14,(IVal *)((long)&reference0.m_hi + 7));
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in3).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar14,(IVal *)((long)&reference0.m_hi + 6));
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                      (&(variables->out0).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  Environment::bind<float>((Environment *)local_160,pVVar11,(IVal *)&reference1.m_hi);
  pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                      (&(variables->out1).
                        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>);
  Environment::bind<float>((Environment *)local_160,pVVar11,(IVal *)&valueNdx);
  dVar19 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
  pfStack_a48 = (pointer)0x0;
  do {
    if (outputs.out1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage <= pfStack_a48) {
      if (100 < (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        log(this,dVar19);
        tcu::TestLog::operator<<(&local_1070,this_05,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_1070,(char (*) [10])"(Skipped ");
        local_1074 = (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + -100;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_1074);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])" messages.)");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1070);
        dVar19 = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        log(this,dVar19);
        tcu::TestLog::operator<<(&local_11f8,this_06,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<(&local_11f8,(char (*) [5])"All ");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(unsigned_long *)
                                   &outputs.out1.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])" inputs passed.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_11f8);
      }
      else {
        log(this,dVar19);
        tcu::TestLog::operator<<(&local_1378,this_07,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_1378,
                            (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2bb3658);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(unsigned_long *)
                                   &outputs.out1.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])" inputs failed.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1378);
      }
      Environment::~Environment((Environment *)local_160);
      ShaderExecUtil::ShaderSpec::~ShaderSpec((ShaderSpec *)local_e8);
      Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_>::~Outputs
                ((Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_float>_> *)
                 ((long)&spec.source.field_2 + 8));
      return;
    }
    reference0_1.m_hi._7_1_ = 1;
    tcu::Interval::Interval((Interval *)auStack_a68);
    tcu::Interval::Interval((Interval *)auStack_a88);
    if (((ulong)pfStack_a48 & 0xfff) == 0) {
      tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestNode.m_testCtx);
    }
    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                        (&inputs->in0,(size_type)pfStack_a48);
    round<float>(&local_ab8,fmt_00,pvVar15);
    convert<float>(&local_aa0,fmt_00,&local_ab8);
    pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                        ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> *)
                         variables);
    pIVar16 = Environment::lookup<float>((Environment *)local_160,pVVar11);
    pIVar16->m_hi = local_aa0.m_hi;
    pIVar16->m_hasNaN = local_aa0.m_hasNaN;
    *(undefined7 *)&pIVar16->field_0x1 = local_aa0._1_7_;
    pIVar16->m_lo = local_aa0.m_lo;
    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                        (&inputs->in1,(size_type)pfStack_a48);
    round<float>(&local_ae8,fmt_00,pvVar15);
    convert<float>(&local_ad0,fmt_00,&local_ae8);
    pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                        (&(variables->in1).
                          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>)
    ;
    pIVar16 = Environment::lookup<float>((Environment *)local_160,pVVar11);
    pIVar16->m_hi = local_ad0.m_hi;
    pIVar16->m_hasNaN = local_ad0.m_hasNaN;
    *(undefined7 *)&pIVar16->field_0x1 = local_ad0._1_7_;
    pIVar16->m_lo = local_ad0.m_lo;
    pvVar17 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in2,(size_type)pfStack_a48);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar17);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,(IVal *)&ctx.field_0x3e);
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar14);
    pvVar17 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in3,(size_type)pfStack_a48);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar17);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,(IVal *)((long)&ctx.callDepth + 2));
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in3).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar14);
    EvalContext::EvalContext
              ((EvalContext *)local_b30,fmt_00,(this->m_ctx).precision,(Environment *)local_160,0);
    Statement::execute(stmt,(EvalContext *)local_b30);
    dVar19 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    if (iVar3 == 1) {
LAB_02491b2a:
      pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                          (&(variables->out0).
                            super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                          );
      pIVar16 = Environment::lookup<float>((Environment *)local_160,pVVar11);
      convert<float>(&local_b88,(FloatFormat *)&numErrors,pIVar16);
      reference0_1.m_lo = local_b88.m_hi;
      auStack_a68 = (undefined1  [8])local_b88._0_8_;
      reference0_1._0_8_ = local_b88.m_lo;
      pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)((long)&spec.source.field_2 + 8)
                           ,(size_type)pfStack_a48);
      bVar1 = contains<float>((IVal *)auStack_a68,pvVar18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ba8,"Shader output 0 is outside acceptable range",
                 (allocator<char> *)&builder.m_str.field_0x177);
      bVar1 = tcu::ResultCollector::check(&this->m_status,bVar1,&local_ba8);
      std::__cxx11::string::~string((string *)&local_ba8);
      dVar19 = (double)std::allocator<char>::~allocator
                                 ((allocator<char> *)&builder.m_str.field_0x177);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        reference0_1.m_hi._7_1_ = 0;
      }
    }
    else if (iVar3 == 2) {
      pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::operator*
                          (&(variables->out1).
                            super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                          );
      pIVar16 = Environment::lookup<float>((Environment *)local_160,pVVar11);
      convert<float>(&local_b48,(FloatFormat *)&numErrors,pIVar16);
      reference1_1.m_lo = local_b48.m_hi;
      auStack_a88 = (undefined1  [8])local_b48._0_8_;
      reference1_1._0_8_ = local_b48.m_lo;
      pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                          ((vector<float,_std::allocator<float>_> *)
                           &outputs.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(size_type)pfStack_a48);
      bVar1 = contains<float>((IVal *)auStack_a88,pvVar18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b68,"Shader output 1 is outside acceptable range",&local_b69);
      bVar1 = tcu::ResultCollector::check(&this->m_status,bVar1,&local_b68);
      std::__cxx11::string::~string((string *)&local_b68);
      std::allocator<char>::~allocator(&local_b69);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        reference0_1.m_hi._7_1_ = 0;
      }
      goto LAB_02491b2a;
    }
    if ((reference0_1.m_hi._7_1_ & 1) == 0) {
      env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
           (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
    }
    if (((reference0_1.m_hi._7_1_ & 1) == 0) &&
       ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x65)) {
      log(this,dVar19);
      tcu::TestLog::message((MessageBuilder *)local_d30,this_04);
      if ((reference0_1.m_hi._7_1_ & 1) == 0) {
        local_14d0 = (char (*) [7])0x2b83a17;
      }
      else {
        local_14d0 = (char (*) [7])0x2c49ea1;
      }
      pMVar5 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_d30,local_14d0);
      tcu::MessageBuilder::operator<<(pMVar5,(char (*) [10])" sample:\n");
      if (0 < iVar2) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_d30,(char (*) [2])0x2b9722a);
        pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::
                  operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_> *)
                             variables);
        Variable<float>::getName_abi_cxx11_(&local_d50,pVVar11);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_d50);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2be9a12);
        pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                            (&inputs->in0,(size_type)pfStack_a48);
        valueToString<float>(&local_d70,(FloatFormat *)&numErrors,pvVar15);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_d70);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
        std::__cxx11::string::~string((string *)&local_d70);
        std::__cxx11::string::~string((string *)&local_d50);
      }
      if (1 < iVar2) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_d30,(char (*) [2])0x2b9722a);
        pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::
                  operator->(&(variables->in1).
                              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                            );
        Variable<float>::getName_abi_cxx11_(&local_d90,pVVar11);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_d90);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2be9a12);
        pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                            (&inputs->in1,(size_type)pfStack_a48);
        valueToString<float>(&local_db0,(FloatFormat *)&numErrors,pvVar15);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_db0);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
        std::__cxx11::string::~string((string *)&local_db0);
        std::__cxx11::string::~string((string *)&local_d90);
      }
      if (2 < iVar2) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_d30,(char (*) [2])0x2b9722a);
        pVVar14 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in2).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_dd0,pVVar14);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_dd0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2be9a12);
        pvVar17 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in2,(size_type)pfStack_a48);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_df0,(FloatFormat *)&numErrors,pvVar17);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_df0);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
        std::__cxx11::string::~string((string *)&local_df0);
        std::__cxx11::string::~string((string *)&local_dd0);
      }
      if (3 < iVar2) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_d30,(char (*) [2])0x2b9722a);
        pVVar14 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in3).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_e10,pVVar14);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_e10);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2be9a12);
        pvVar17 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in3,(size_type)pfStack_a48);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_e30,(FloatFormat *)&numErrors,pvVar17);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_e30);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
        std::__cxx11::string::~string((string *)&local_e30);
        std::__cxx11::string::~string((string *)&local_e10);
      }
      if (0 < iVar3) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_d30,(char (*) [2])0x2b9722a);
        pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::
                  operator->(&(variables->out0).
                              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                            );
        Variable<float>::getName_abi_cxx11_(&local_e50,pVVar11);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_e50);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2be9a12);
        pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             ((long)&spec.source.field_2 + 8),(size_type)pfStack_a48);
        valueToString<float>(&local_e70,(FloatFormat *)&numErrors,pvVar18);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_e70);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])"\tExpected range: ");
        intervalToString<float>(&local_e90,(FloatFormat *)&numErrors,(IVal *)auStack_a68);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_e90);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
        std::__cxx11::string::~string((string *)&local_e90);
        std::__cxx11::string::~string((string *)&local_e70);
        std::__cxx11::string::~string((string *)&local_e50);
      }
      if (1 < iVar3) {
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_d30,(char (*) [2])0x2b9722a);
        pVVar11 = de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>::
                  operator->(&(variables->out1).
                              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                            );
        Variable<float>::getName_abi_cxx11_(&local_eb0,pVVar11);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_eb0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [4])0x2be9a12);
        pvVar18 = std::vector<float,_std::allocator<float>_>::operator[]
                            ((vector<float,_std::allocator<float>_> *)
                             &outputs.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage,(size_type)pfStack_a48);
        valueToString<float>(&local_ed0,(FloatFormat *)&numErrors,pvVar18);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_ed0);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])"\tExpected range: ");
        intervalToString<float>(&local_ef0,(FloatFormat *)&numErrors,(IVal *)auStack_a88);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_ef0);
        tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b9e07b);
        std::__cxx11::string::~string((string *)&local_ef0);
        std::__cxx11::string::~string((string *)&local_ed0);
        std::__cxx11::string::~string((string *)&local_eb0);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_d30,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_d30);
      dVar19 = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
    }
    pfStack_a48 = (pointer)((long)pfStack_a48 + 1);
  } while( true );
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}